

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Tensor::Tensor(Tensor *this,Tensor *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Tensor_006ff110;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->dimvalue_).current_size_ = 0;
  (this->dimvalue_).total_size_ = 0;
  (this->dimvalue_).rep_ = (Rep *)0x0;
  new_size = (from->dimvalue_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->dimvalue_,new_size);
    memcpy(((this->dimvalue_).rep_)->elements,((from->dimvalue_).rep_)->elements,
           (long)(from->dimvalue_).current_size_ << 3);
    (this->dimvalue_).current_size_ = (from->dimvalue_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->rank_ = from->rank_;
  return;
}

Assistant:

Tensor::Tensor(const Tensor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      dimvalue_(from.dimvalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  rank_ = from.rank_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Tensor)
}